

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

module_ * __thiscall
pybind11::module_::def<bool(*)(std::__cxx11::string_const&),char[146]>
          (module_ *this,char *name_,
          _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f,
          char (*extra) [146])

{
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f_00;
  handle local_60;
  name local_58;
  handle local_50;
  object local_48;
  handle local_40;
  cpp_function func;
  
  f_00 = *f;
  local_50.m_ptr = (this->super_object).super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58.value = name_;
  func.super_function.super_object.super_handle.m_ptr = (function)PyObject_GetAttrString();
  if ((handle)func.super_function.super_object.super_handle.m_ptr == (handle)0x0) {
    PyErr_Clear();
    func.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_60.m_ptr = (PyObject *)func.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<bool,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,char[146]>
            ((cpp_function *)&local_40,f_00,&local_58,(scope *)&local_50,(sibling *)&local_60,extra)
  ;
  object::~object((object *)&func);
  object::~object(&local_48);
  add_object(this,name_,local_40,true);
  object::~object((object *)&local_40);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }